

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

TPZAutoPointer<TPZStructMatrix>
TPZAutoPointerDynamicCast<TPZStructMatrix,TPZSavable>(TPZAutoPointer<TPZSavable> *in)

{
  undefined8 *in_RSI;
  TPZReference *in_RDI;
  TPZStructMatrix *p;
  TPZAutoPointer<TPZStructMatrix> *rv;
  TPZStructMatrix *this;
  long local_58;
  TPZReference *pTVar1;
  
  pTVar1 = in_RDI;
  TPZAutoPointer<TPZStructMatrix>::TPZAutoPointer((TPZAutoPointer<TPZStructMatrix> *)in_RDI);
  if (*(long *)*in_RSI == 0) {
    local_58 = 0;
  }
  else {
    local_58 = __dynamic_cast(*(long *)*in_RSI,&TPZSavable::typeinfo,&TPZStructMatrix::typeinfo,
                              0xffffffffffffffff);
  }
  if (local_58 != 0) {
    this = pTVar1->fPointer;
    if (this != (TPZStructMatrix *)0x0) {
      TPZAutoPointer<TPZStructMatrix>::TPZReference::~TPZReference((TPZReference *)this);
      operator_delete(this,0x10);
    }
    pTVar1->fPointer = (TPZStructMatrix *)*in_RSI;
    TPZAutoPointer<TPZStructMatrix>::TPZReference::Increment((TPZReference *)pTVar1->fPointer);
  }
  return (TPZAutoPointer<TPZStructMatrix>)in_RDI;
}

Assistant:

TPZAutoPointer<R> TPZAutoPointerDynamicCast(TPZAutoPointer<T> in) {
    TPZAutoPointer<R> rv;
    if (R* p; (p = dynamic_cast<R*> (in.fRef->fPointer)) ) {
        delete rv.fRef;
        rv.fRef = (typename TPZAutoPointer<R>::TPZReference *) in.fRef;
        rv.fRef->Increment();
    }
    return rv;
}